

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O1

void Style::addFieldAlias(Entry *entry,u16string *alias,u16string *actual)

{
  pointer pbVar1;
  vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *pvVar2;
  pointer pcVar3;
  u16string *__x;
  int iVar4;
  iterator iVar5;
  __normal_iterator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_*,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>
  _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar7;
  long lVar8;
  vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *pvVar9;
  __hashtable *__h;
  pointer this;
  initializer_list<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  __l;
  Field actualFieldCopy;
  allocator_type local_139;
  u16string *local_138;
  Constraints *local_130;
  vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
  local_128;
  undefined1 local_110 [64];
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [32];
  _Alloc_hider local_90 [2];
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  local_80 [3];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  iVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(entry->fields)._M_h,actual);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
      ._M_cur != (__node_type *)0x0) {
    local_110._0_8_ = local_110 + 0x10;
    local_138 = alias;
    std::__cxx11::u16string::_M_construct<char16_t*>
              ((u16string *)local_110,
               *(long *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                               ._M_cur + 0x28),
               *(long *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                               ._M_cur + 0x28) +
               *(long *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                               ._M_cur + 0x30) * 2);
    local_110._32_4_ =
         *(Type *)((long)iVar5.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                         ._M_cur + 0x48);
    local_110._36_4_ =
         *(Format *)
          ((long)iVar5.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                 ._M_cur + 0x4c);
    local_110._40_4_ =
         *(Data *)((long)iVar5.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                         ._M_cur + 0x50);
    local_110._44_4_ =
         *(undefined4 *)
          ((long)iVar5.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                 ._M_cur + 0x54);
    local_110._48_4_ =
         *(ConstraintType *)
          ((long)iVar5.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                 ._M_cur + 0x58);
    local_110._52_4_ =
         *(int *)((long)iVar5.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                        ._M_cur + 0x5c);
    local_110._56_4_ =
         *(int *)((long)iVar5.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                        ._M_cur + 0x60);
    local_d0._M_p = (pointer)&local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,
               *(long *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                               ._M_cur + 0x68),
               *(long *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                               ._M_cur + 0x70) +
               *(long *)((long)iVar5.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>,_true>
                               ._M_cur + 0x68));
    __x = local_138;
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
    _M_assign((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
              local_110,local_138);
    std::
    pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
    ::pair<Style::Field_&,_true>
              ((pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
                *)local_b0,__x,(Field *)local_110);
    std::
    _Hashtable<std::__cxx11::u16string,std::pair<std::__cxx11::u16string_const,Style::Field>,std::allocator<std::pair<std::__cxx11::u16string_const,Style::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::u16string_const,Style::Field>>
              ((_Hashtable<std::__cxx11::u16string,std::pair<std::__cxx11::u16string_const,Style::Field>,std::allocator<std::pair<std::__cxx11::u16string_const,Style::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&entry->fields,local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p != &local_40) {
      operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
    }
    paVar7 = local_80;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_90[0]._M_p != paVar7) {
      operator_delete(local_90[0]._M_p,local_80[0]._M_allocated_capacity * 2 + 2);
    }
    if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ * 2 + 2);
    }
    this = (entry->constraints).all.
           super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (entry->constraints).all.
             super__Vector_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this != pbVar1) {
      local_130 = &entry->constraints;
      lVar8 = -(long)this;
LAB_00193b19:
      iVar4 = std::__cxx11::
              basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::compare
                        (this,actual);
      if (iVar4 != 0) goto code_r0x00193b28;
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::_M_erase(&local_130->all,
                 (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                 -lVar8);
      local_b0._0_8_ = local_b0 + 0x10;
      pcVar3 = (actual->_M_dataplus)._M_p;
      std::__cxx11::u16string::_M_construct<char16_t*>
                ((u16string *)local_b0,pcVar3,pcVar3 + actual->_M_string_length);
      pcVar3 = (local_138->_M_dataplus)._M_p;
      local_90[0]._M_p = (pointer)paVar7;
      std::__cxx11::u16string::_M_construct<char16_t*>
                ((u16string *)local_90,pcVar3,pcVar3 + local_138->_M_string_length);
      __l._M_len = 2;
      __l._M_array = (iterator)local_b0;
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::vector(&local_128,__l,&local_139);
      std::
      vector<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>,std::allocator<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>>
      ::emplace_back<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>
                ((vector<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>,std::allocator<std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>>
                  *)&(entry->constraints).one,&local_128);
      std::
      vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
      ::~vector(&local_128);
      lVar8 = -0x40;
      do {
        if (paVar7 != *(anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                        **)(paVar7->_M_local_buf + -8)) {
          operator_delete(*(anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                            **)(paVar7->_M_local_buf + -8),paVar7->_M_allocated_capacity * 2 + 2);
        }
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                  *)(paVar7->_M_local_buf + -0x10);
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0);
      goto LAB_00193c84;
    }
LAB_00193b35:
    pvVar2 = (vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)
             (entry->constraints).some.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar9 = (vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)
                  (entry->constraints).some.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar2;
        pvVar9 = pvVar9 + 0x18) {
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::u16string*,std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::u16string_const>>
                        (*(undefined8 *)pvVar9,*(undefined8 *)(pvVar9 + 8),actual);
      if (_Var6._M_current !=
          *(basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> **)
           (pvVar9 + 8)) {
        std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>::
        emplace_back<std::__cxx11::u16string_const&>(pvVar9,local_138);
        goto LAB_00193c84;
      }
    }
    pvVar2 = (vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)
             (entry->constraints).one.
             super__Vector_base<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar9 = (vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>> *)
                  (entry->constraints).one.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar9 != pvVar2;
        pvVar9 = pvVar9 + 0x18) {
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::u16string*,std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::u16string_const>>
                        (*(undefined8 *)pvVar9,*(undefined8 *)(pvVar9 + 8),actual);
      if (_Var6._M_current !=
          *(basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> **)
           (pvVar9 + 8)) {
        std::vector<std::__cxx11::u16string,std::allocator<std::__cxx11::u16string>>::
        emplace_back<std::__cxx11::u16string_const&>(pvVar9,local_138);
        break;
      }
    }
LAB_00193c84:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_p != &local_c0) {
      operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_,local_110._16_8_ * 2 + 2);
    }
  }
  return;
code_r0x00193b28:
  this = this + 1;
  lVar8 = lVar8 + -0x20;
  if (this == pbVar1) goto LAB_00193b35;
  goto LAB_00193b19;
}

Assistant:

void addFieldAlias (Entry &entry, const u16string &alias, const u16string &actual) {
    auto itr = entry.fields.find(actual);
    if (itr == entry.fields.end()) return;

    Field actualFieldCopy = itr->second;
    actualFieldCopy.name = alias;

    entry.fields.insert({ alias, actualFieldCopy });


    // TODO: Well, you get the idea
    auto &constraints = entry.constraints;
    for (auto itr2 = constraints.all.begin(), end = constraints.all.end(); itr2 != end; itr2++) {
        if (*itr2 == actual) {
            constraints.all.erase(itr2);
            constraints.one.emplace_back(vector { actual, alias });
            return;
        }
    }

    for (auto &fields : constraints.some) {
        if (std::find(fields.begin(), fields.end(), actual) != fields.end()) {
            fields.emplace_back(alias);
            return;
        }
    }

    for (auto &fields : constraints.one) {
        if (std::find(fields.begin(), fields.end(), actual) != fields.end()) {
            fields.emplace_back(alias);
            return;
        }
    }
}